

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

void __thiscall bssl::TemporaryFile::~TemporaryFile(TemporaryFile *this)

{
  int iVar1;
  
  if ((this->path_)._M_string_length != 0) {
    iVar1 = unlink((this->path_)._M_dataplus._M_p);
    if (iVar1 != 0) {
      perror("Could not delete file");
    }
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TemporaryFile::~TemporaryFile() {
#if defined(OPENSSL_WINDOWS)
  if (!path_.empty() && !DeleteFileA(path_.c_str())) {
    PrintLastError("Could not delete file");
  }
#else
  if (!path_.empty() && unlink(path_.c_str()) != 0) {
    perror("Could not delete file");
  }
#endif
}